

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

bool __thiscall
gl3cts::ClipDistance::CoverageTest::EnableDisableTest(CoverageTest *this,Functions *gl)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_370;
  MessageBuilder local_360;
  int local_1dc;
  GetNameFunc p_Stack_1d8;
  GLint i_1;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  int local_28;
  GLenum local_24;
  GLint i;
  GLint error_code;
  Functions *gl_local;
  CoverageTest *this_local;
  
  _i = gl;
  gl_local = (Functions *)this;
  for (local_28 = 0; local_24 = 0, local_28 < this->m_gl_max_clip_distances_value;
      local_28 = local_28 + 1) {
    (*_i->enable)(local_28 + 0x3000);
    local_24 = (*_i->getError)();
    if (local_24 != 0) {
      pTVar1 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1a8,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<
                         (&local_1a8,(char (*) [26])"glEnable(GL_CLIP_DISTANCE");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_28);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [23])0x299f912);
      EVar3 = glu::getErrorStr(local_24);
      p_Stack_1d8 = EVar3.m_getName;
      local_1d0 = EVar3.m_value;
      local_1c8[0].m_getName = p_Stack_1d8;
      local_1c8[0].m_value = local_1d0;
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1c8);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [25])" instead of GL_NO_ERROR.");
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
      return false;
    }
  }
  local_1dc = 0;
  while( true ) {
    local_24 = 0;
    if (this->m_gl_max_clip_distances_value <= local_1dc) {
      return true;
    }
    (*_i->disable)(local_1dc + 0x3000);
    local_24 = (*_i->getError)();
    if (local_24 != 0) break;
    local_1dc = local_1dc + 1;
  }
  pTVar1 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_360,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [27])"glDisable(GL_CLIP_DISTANCE");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1dc);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [23])0x299f912);
  EVar3 = glu::getErrorStr(local_24);
  local_370.m_getName = EVar3.m_getName;
  local_370.m_value = EVar3.m_value;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_370);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [25])" instead of GL_NO_ERROR.");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_360);
  return false;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::EnableDisableTest(const glw::Functions& gl)
{
	/*  Check that calling Enable and Disable with GL_CLIP_DISTANCEi for all
	 available clip distances does not generate errors.
	 glw::GLint error_code = GL_NO_ERROR; */

	glw::GLint error_code = GL_NO_ERROR;

	/* Test glEnable */
	for (glw::GLint i = 0; i < m_gl_max_clip_distances_value; ++i)
	{
		gl.enable(GL_CLIP_DISTANCE0 + i);

		error_code = gl.getError();

		if (error_code != GL_NO_ERROR)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glEnable(GL_CLIP_DISTANCE" << i << ") returned error code "
							   << glu::getErrorStr(error_code) << " instead of GL_NO_ERROR."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	/* Test glDisable */
	for (glw::GLint i = 0; i < m_gl_max_clip_distances_value; ++i)
	{
		gl.disable(GL_CLIP_DISTANCE0 + i);

		error_code = gl.getError();

		if (error_code != GL_NO_ERROR)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glDisable(GL_CLIP_DISTANCE" << i << ") returned error code "
							   << glu::getErrorStr(error_code) << " instead of GL_NO_ERROR."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}